

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O2

void __thiscall CEditor::RenderGrid(CEditor *this,CLayerGroup *pGroup)

{
  float fVar1;
  float fVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  CUIRect *pCVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  long in_FS_OFFSET;
  float fVar11;
  float fVar12;
  vec4 vVar13;
  int local_78;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float aGroupPoints [4];
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_GridActive == true) {
    CLayerGroup::Mapping(pGroup,aGroupPoints);
    pCVar6 = CUI::Screen(&this->m_UI);
    fVar1 = pCVar6->w;
    pCVar6 = CUI::Screen(&this->m_UI);
    fVar2 = pCVar6->h;
    iVar4 = GetLineDistance(this);
    local_78 = (int)(aGroupPoints[0] / (float)iVar4);
    iVar10 = (int)(aGroupPoints[1] / (float)iVar4);
    uVar9 = (long)local_78 % (long)this->m_GridFactor & 0xffffffff;
    uVar8 = (long)iVar10 % (long)this->m_GridFactor & 0xffffffff;
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x13])
              (this->m_pGraphics,0xffffffffffffffff);
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x14])();
    local_78 = local_78 * iVar4;
    fVar11 = (float)local_78;
    iVar10 = iVar10 * iVar4;
    fVar12 = (float)iVar10;
    iVar5 = (int)fVar1;
    iVar7 = 0;
    if (0 < iVar5) {
      iVar7 = iVar5;
    }
    while (iVar7 != 0) {
      vVar13 = HexToRgba(*(int *)(this->m_pConfig->m_ClVersionServer +
                                 (ulong)((int)uVar8 % this->m_GridFactor == 0) * 4 + -0x38));
      (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                (vVar13._0_8_,CONCAT44(vVar13.field_1,vVar13.field_1),vVar13.field_2.z,
                 vVar13.field_3.w);
      local_54 = (float)iVar10;
      local_50 = aGroupPoints[2] + fVar1;
      local_58 = fVar11;
      local_4c = local_54;
      (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x16])(this->m_pGraphics,&local_58,1)
      ;
      vVar13 = HexToRgba(*(int *)(this->m_pConfig->m_ClVersionServer +
                                 (ulong)((int)uVar9 % this->m_GridFactor == 0) * 4 + -0x38));
      (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
                (vVar13._0_8_,CONCAT44(vVar13.field_1,vVar13.field_1),vVar13.field_2.z,
                 vVar13.field_3.w);
      local_58 = (float)local_78;
      local_4c = aGroupPoints[3] + fVar2;
      local_54 = fVar12;
      local_50 = local_58;
      (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x16])(this->m_pGraphics,&local_58,1)
      ;
      uVar8 = (ulong)((int)uVar8 + 1);
      local_78 = local_78 + iVar4;
      iVar10 = iVar10 + iVar4;
      uVar9 = (ulong)((int)uVar9 + 1);
      iVar7 = iVar7 + -1;
    }
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x21])
              (0x3f800000,0x3f800000,0x3f800000,0x3f800000);
    (*(this->m_pGraphics->super_IInterface)._vptr_IInterface[0x15])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CEditor::RenderGrid(CLayerGroup *pGroup)
{
	if(!m_GridActive)
		return;

	vec4 GridColor;
	float aGroupPoints[4];
	pGroup->Mapping(aGroupPoints);

	float w = UI()->Screen()->w;
	float h = UI()->Screen()->h;

	int LineDistance = GetLineDistance();

	int XOffset = aGroupPoints[0]/LineDistance;
	int YOffset = aGroupPoints[1]/LineDistance;
	int XGridOffset = XOffset % m_GridFactor;
	int YGridOffset = YOffset % m_GridFactor;

	Graphics()->TextureClear();
	Graphics()->LinesBegin();

	for(int i = 0; i < (int)w; i++)
	{
		if((i+YGridOffset) % m_GridFactor == 0)
			GridColor = HexToRgba(Config()->m_EdColorGridOuter);
		else
			GridColor = HexToRgba(Config()->m_EdColorGridInner);

		Graphics()->SetColor(GridColor.r, GridColor.g, GridColor.b, GridColor.a);
		IGraphics::CLineItem Line = IGraphics::CLineItem(LineDistance*XOffset, LineDistance*i+LineDistance*YOffset, w+aGroupPoints[2], LineDistance*i+LineDistance*YOffset);
		Graphics()->LinesDraw(&Line, 1);

		if((i+XGridOffset) % m_GridFactor == 0)
			GridColor = HexToRgba(Config()->m_EdColorGridOuter);
		else
			GridColor = HexToRgba(Config()->m_EdColorGridInner);

		Graphics()->SetColor(GridColor.r, GridColor.g, GridColor.b, GridColor.a);
		Line = IGraphics::CLineItem(LineDistance*i+LineDistance*XOffset, LineDistance*YOffset, LineDistance*i+LineDistance*XOffset, h+aGroupPoints[3]);
		Graphics()->LinesDraw(&Line, 1);
	}
	Graphics()->SetColor(1.0f, 1.0f, 1.0f, 1.0f);
	Graphics()->LinesEnd();
}